

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::TestCallback::toAdmin(TestCallback *this,Message *message,SessionID *param_2)

{
  FieldMap *this_00;
  string *psVar1;
  undefined1 *puVar2;
  undefined1 local_80 [8];
  MsgType msgType;
  SessionID *param_2_local;
  Message *message_local;
  TestCallback *this_local;
  
  msgType.super_StringField.super_FieldBase.m_metrics._8_8_ = param_2;
  FIX::MsgType::MsgType((MsgType *)local_80);
  this_00 = &FIX::Message::getHeader(message)->super_FieldMap;
  FIX::FieldMap::getField(this_00,(FieldBase *)local_80);
  psVar1 = FIX::StringField::getValue_abi_cxx11_((StringField *)local_80);
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)psVar1);
  switch(*puVar2) {
  case 0x30:
    this->toHeartbeat = this->toHeartbeat + 1;
    FIX::Message::operator=(&this->sentHeartbeat,message);
    break;
  case 0x32:
    this->toResendRequest = this->toResendRequest + 1;
    FIX::Message::operator=(&this->sentResendRequest,message);
    break;
  case 0x33:
    this->toReject = this->toReject + 1;
    break;
  case 0x34:
    this->toSequenceReset = this->toSequenceReset + 1;
    break;
  case 0x35:
    this->toLogout = this->toLogout + 1;
    break;
  case 0x41:
    this->toLogon = this->toLogon + 1;
    FIX::Message::operator=(&this->sentLogon,message);
  }
  FIX::MsgType::~MsgType((MsgType *)local_80);
  return;
}

Assistant:

virtual void toAdmin( FIX::Message& message, const SessionID& )
  {
    MsgType msgType;
    message.getHeader().getField( msgType );
    switch ( msgType.getValue() [ 0 ] )
    {
      case 'A':
      toLogon++; sentLogon = message; break;
      case '2':
      toResendRequest++;
      sentResendRequest = message; break;
      case '0':
      toHeartbeat++; sentHeartbeat = message; break;
      case '5':
      toLogout++; break;
      case '3':
      toReject++; break;
      case '4':
      toSequenceReset++; break;
    }
  }